

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine_options.hpp
# Opt level: O2

bool __thiscall
duckdb::CSVStateMachineOptions::operator==
          (CSVStateMachineOptions *this,CSVStateMachineOptions *other)

{
  __type _Var1;
  bool bVar2;
  
  _Var1 = ::std::operator==(&(this->delimiter).value,&(other->delimiter).value);
  if ((((_Var1) && ((this->quote).value == (other->quote).value)) &&
      ((this->escape).value == (other->escape).value)) &&
     (((this->new_line).value == (other->new_line).value &&
      ((this->comment).value == (other->comment).value)))) {
    bVar2 = (this->strict_mode).value == (other->strict_mode).value;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator==(const CSVStateMachineOptions &other) const {
		return delimiter == other.delimiter && quote == other.quote && escape == other.escape &&
		       new_line == other.new_line && comment == other.comment && strict_mode == other.strict_mode;
	}